

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * start_capture(MatchState *ms,char *s,char *p,int what)

{
  int iVar1;
  char *pcVar2;
  int in_ECX;
  undefined8 in_RSI;
  long in_RDI;
  int level;
  char *res;
  undefined4 in_stack_00000018;
  ErrMsg in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar1 = *(int *)(in_RDI + 0x18);
  if (0x1f < iVar1) {
    lj_err_caller((lua_State *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  }
  *(undefined8 *)(in_RDI + 0x20 + (long)iVar1 * 0x10) = in_RSI;
  *(long *)(in_RDI + (long)iVar1 * 0x10 + 0x28) = (long)in_ECX;
  *(int *)(in_RDI + 0x18) = iVar1 + 1;
  pcVar2 = match((MatchState *)p,(char *)CONCAT44(what,in_stack_00000018),res);
  if (pcVar2 == (char *)0x0) {
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + -1;
  }
  return pcVar2;
}

Assistant:

static const char *start_capture(MatchState *ms, const char *s,
				 const char *p, int what)
{
  const char *res;
  int level = ms->level;
  if (level >= LUA_MAXCAPTURES) lj_err_caller(ms->L, LJ_ERR_STRCAPN);
  ms->capture[level].init = s;
  ms->capture[level].len = what;
  ms->level = level+1;
  if ((res=match(ms, s, p)) == NULL)  /* match failed? */
    ms->level--;  /* undo capture */
  return res;
}